

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state_machine_options.hpp
# Opt level: O2

void __thiscall
duckdb::CSVStateMachineOptions::CSVStateMachineOptions
          (CSVStateMachineOptions *this,string *delimiter_p,char quote_p,char escape_p,
          char comment_p,NewLineIdentifier new_line_p,bool strict_mode_p)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  ::std::__cxx11::string::string((string *)&local_50,(string *)delimiter_p);
  CSVOption<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  CSVOption(&this->delimiter,&local_50);
  ::std::__cxx11::string::~string((string *)&local_50);
  (this->quote).set_by_user = false;
  (this->quote).value = quote_p;
  (this->escape).set_by_user = false;
  (this->escape).value = escape_p;
  (this->comment).set_by_user = false;
  (this->comment).value = comment_p;
  (this->new_line).set_by_user = false;
  (this->new_line).value = new_line_p;
  (this->strict_mode).set_by_user = false;
  (this->strict_mode).value = strict_mode_p;
  return;
}

Assistant:

CSVStateMachineOptions(string delimiter_p, char quote_p, char escape_p, char comment_p,
	                       NewLineIdentifier new_line_p, bool strict_mode_p)
	    : delimiter(std::move(delimiter_p)), quote(quote_p), escape(escape_p), comment(comment_p), new_line(new_line_p),
	      strict_mode(strict_mode_p) {}